

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_counting.cpp
# Opt level: O0

void counting_sort<int>(int *arr,int n)

{
  bool bVar1;
  mapped_type *pmVar2;
  reference ppVar3;
  int local_84;
  int i_1;
  pair<const_int,_int> *kv;
  iterator __end1;
  iterator __begin1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range1;
  int j;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> counter;
  int n_local;
  int *arr_local;
  
  counter._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = n;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_48)
  ;
  for (local_4c = 0; local_4c < counter._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      local_4c = local_4c + 1) {
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_48,arr + local_4c);
    *pmVar2 = *pmVar2 + 1;
  }
  __range1._0_4_ = -1;
  __end1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      local_48);
  kv = (pair<const_int,_int> *)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                 ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  local_48);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&kv);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator*(&__end1);
    for (local_84 = 0; local_84 < ppVar3->second; local_84 = local_84 + 1) {
      __range1._0_4_ = (int)__range1 + 1;
      arr[(int)__range1] = ppVar3->first;
    }
    std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&__end1);
  }
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_48)
  ;
  return;
}

Assistant:

void counting_sort(T *arr, int n) {
  std::map<int, int> counter;
  for (int i = 0; i < n; ++i)
    ++counter[arr[i]];

  int j = -1;
  for (const auto &kv: counter) {
    for (auto i = 0; i < kv.second; ++i) arr[++j] = kv.first;
  }
}